

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemViewPrivate::columnsAboutToBeRemoved
          (QAbstractItemViewPrivate *this,QModelIndex *parent,int start,int end)

{
  int iVar1;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar2;
  Span *pSVar3;
  QWidget *this_01;
  QObject *pQVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *pDVar9;
  long *plVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  Data *pDVar14;
  size_t sVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  piter it;
  code *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  QModelIndex local_a8;
  QModelIndex local_88;
  void *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  QAbstractItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  *(undefined4 *)(*(long *)(this_00 + 8) + 0x3a8) = 5;
  local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_88,this_00);
  if ((((-1 < (local_88.r | local_88.c)) && (local_88.m.ptr != (QAbstractItemModel *)0x0)) &&
      (this->selectionMode == SingleSelection)) && ((start <= local_88.c && (local_88.c <= end)))) {
    iVar7 = (**(code **)(*(long *)this->model + 0x80))(this->model,parent);
    if (end - start < iVar7) {
      local_a8._0_8_ = (Data *)0xffffffffffffffff;
      local_a8.i = 0;
      local_a8.m.ptr = (QAbstractItemModel *)0x0;
      pQVar2 = this->model;
      if (local_88.m.ptr == (QAbstractItemModel *)0x0) {
        local_58._0_8_ = (Data *)0xffffffffffffffff;
        local_58._8_8_ = (QObject *)0x0;
        local_48 = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*(long *)local_88.m.ptr + 0x68))(local_58,local_88.m.ptr,&local_88);
      }
      iVar8 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,local_58);
      iVar7 = end;
      if (end < iVar8) {
        do {
          while( true ) {
            uVar5 = local_88._0_8_;
            pQVar2 = this->model;
            if (local_88.m.ptr == (QAbstractItemModel *)0x0) {
              local_c0 = (code *)0xffffffffffffffff;
              local_b8 = 0;
              uStack_b0 = 0;
            }
            else {
              (**(code **)(*(long *)local_88.m.ptr + 0x68))(&local_c0,local_88.m.ptr,&local_88);
            }
            iVar1 = iVar7 + 1;
            (**(code **)(*(long *)pQVar2 + 0x60))
                      (local_58,pQVar2,uVar5 & 0xffffffff,iVar7,&local_c0);
            local_a8.m.ptr = local_48;
            local_a8._0_8_ = local_58._0_8_;
            local_a8.i = local_58._8_8_;
            cVar6 = (**(code **)(*(long *)this_00 + 0x2c0))(this_00,&local_a8);
            iVar7 = iVar1;
            if (cVar6 != '\0') break;
            uVar11 = (**(code **)(*(long *)this->model + 0x138))(this->model,&local_a8);
            if (((uVar11 & 0x20) != 0) || (iVar8 <= iVar1)) goto LAB_0053a97a;
          }
        } while (iVar1 < iVar8);
      }
    }
    else {
      local_a8.i = parent->i;
      local_a8.m.ptr = (parent->m).ptr;
      uVar13 = parent->c;
      uVar12 = parent->r;
      pDVar14 = *(Data **)parent;
      if (local_a8.m.ptr != (QAbstractItemModel *)0x0 && -1 < (parent->r | parent->c)) {
        local_a8._0_8_ = *(Data **)parent;
        while (uVar11 = (**(code **)(*(long *)this->model + 0x138))(this->model,&local_a8),
              (uVar11 & 0x20) == 0) {
          if (local_a8.m.ptr == (QAbstractItemModel *)0x0) {
            local_58._0_8_ = (Data *)0xffffffffffffffff;
            local_58._8_8_ = (QObject *)0x0;
            local_48 = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_a8.m.ptr + 0x68))(local_58,local_a8.m.ptr,&local_a8);
          }
          local_a8.m.ptr = local_48;
          local_a8.r = local_58._0_4_;
          local_a8.c = local_58._4_4_;
          pDVar14 = (Data *)local_a8._0_8_;
          local_a8.i = local_58._8_8_;
          local_a8.r = (int)local_58._0_8_;
          local_a8.c = SUB84(local_58._0_8_,4);
          uVar13 = local_a8.c;
          uVar12 = local_a8.r;
          if (((local_a8.r < 0) || ((long)local_58._0_8_ < 0)) ||
             (local_a8._0_8_ = (Data *)local_58._0_8_, local_48 == (QAbstractItemModel *)0x0))
          goto LAB_0053a964;
        }
        uVar13 = local_a8.c;
        uVar12 = local_a8.r;
        pDVar14 = (Data *)local_a8._0_8_;
      }
LAB_0053a964:
      local_a8._0_8_ = pDVar14;
      if ((((int)uVar12 < 0) || ((int)uVar13 < 0)) || (local_a8.m.ptr == (QAbstractItemModel *)0x0))
      goto LAB_0053a97f;
    }
LAB_0053a97a:
    QAbstractItemView::setCurrentIndex(this_00,&local_a8);
  }
LAB_0053a97f:
  pDVar9 = (this->editorIndexHash).d;
  if (pDVar9 == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) {
    pDVar9 = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0;
    sVar15 = 0;
LAB_0053aa05:
    if (pDVar9 == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0 && sVar15 == 0)
    goto LAB_0053acd8;
  }
  else {
    if (1 < (uint)(pDVar9->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar9 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::detached
                         (pDVar9);
      (this->editorIndexHash).d = pDVar9;
    }
    if (pDVar9->spans->offsets[0] == 0xff) {
      uVar11 = 1;
      do {
        sVar15 = uVar11;
        if (pDVar9->numBuckets == sVar15) {
          pDVar9 = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0;
          sVar15 = 0;
          break;
        }
        uVar11 = sVar15 + 1;
      } while (pDVar9->spans[sVar15 >> 7].offsets[(uint)sVar15 & 0x7f] == 0xff);
      goto LAB_0053aa05;
    }
    sVar15 = 0;
  }
  it.bucket = sVar15;
  it.d = pDVar9;
  do {
    uVar16 = it.bucket;
    pDVar9 = it.d;
    local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    uVar11 = uVar16 >> 7;
    uVar13 = (uint)it.bucket & 0x7f;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_a8,
               (QPersistentModelIndex *)
               (pDVar9->spans[uVar11].entries[pDVar9->spans[uVar11].offsets[uVar13]].storage.data +
               8));
    if (local_a8.c < end || start < local_a8.c) {
LAB_0053aae6:
      do {
        if (pDVar9->numBuckets - 1 == uVar16) {
          it = (piter)ZEXT816(0);
          break;
        }
        uVar16 = uVar16 + 1;
        it.bucket = uVar16;
        it.d = pDVar9;
      } while (pDVar9->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
    }
    else {
      (**(code **)(*(long *)this->model + 0x68))(local_58,this->model,&local_a8);
      if (((local_58._0_4_ != parent->r) || (local_58._4_4_ != parent->c)) ||
         (((QObject *)local_58._8_8_ != (QObject *)parent->i || (local_48 != (parent->m).ptr))))
      goto LAB_0053aae6;
      pSVar3 = pDVar9->spans;
      this_01 = *(QWidget **)pSVar3[uVar11].entries[pSVar3[uVar11].offsets[uVar13]].storage.data;
      local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QHash<QPersistentModelIndex,_QEditorInfo>::takeImpl<QPersistentModelIndex>
                ((QEditorInfo *)local_58,&this->indexEditorHash,
                 (QPersistentModelIndex *)
                 (pSVar3[uVar11].entries[pSVar3[uVar11].offsets[uVar13]].storage.data + 8));
      it = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase
                            (&this->editorIndexHash,(const_iterator)it);
      if ((Data *)local_58._0_8_ != (Data *)0x0) {
        if (((*(int *)(local_58._0_8_ + 4) != 0) && ((QObject *)local_58._8_8_ != (QObject *)0x0))
           && (this_01 != (QWidget *)0x0)) {
          pQVar4 = *(QObject **)
                    &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x8;
          local_c0 = QObject::destroyed;
          local_b8 = 0;
          local_68 = (void *)0x2a1;
          local_60 = 0;
          QObject::disconnectImpl
                    (&this_01->super_QObject,&local_c0,pQVar4,&local_68,
                     (QMetaObject *)&QObject::staticMetaObject);
          QObject::removeEventFilter(&this_01->super_QObject);
          QWidget::hide(this_01);
          plVar10 = (long *)(**(code **)(*(long *)pQVar4 + 0x208))(pQVar4,&local_a8);
          if (plVar10 == (long *)0x0) {
            QObject::deleteLater();
          }
          else {
            (**(code **)(*plVar10 + 0x78))(plVar10,this_01,&local_a8);
          }
        }
        if ((Data *)local_58._0_8_ != (Data *)0x0) {
          LOCK();
          *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_58._0_8_ == 0) {
            pDVar14 = (Data *)local_58._0_8_;
            if ((Data *)local_58._0_8_ == (Data *)0x0) {
              pDVar14 = (Data *)0x0;
            }
            operator_delete(pDVar14);
          }
        }
      }
    }
  } while ((it.d != (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) ||
          (it.bucket != 0));
LAB_0053acd8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::columnsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_Q(QAbstractItemView);

    q->setState(QAbstractItemView::CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = q->currentIndex();
    if (current.isValid()
        && selectionMode == QAbstractItemView::SingleSelection
        && current.column() >= start
        && current.column() <= end) {
        int totalToRemove = end - start + 1;
        if (model->columnCount(parent) < totalToRemove) { // no more columns
            QModelIndex index = parent;
            while (index.isValid() && !isIndexEnabled(index))
                index = index.parent();
            if (index.isValid())
                q->setCurrentIndex(index);
        } else {
            int column = end;
            QModelIndex next;
            const int columnCount = model->columnCount(current.parent());
            // find the next visible and enabled item
            while (column < columnCount) {
                next = model->index(current.row(), column++, current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!q->isIndexHidden(next) && isIndexEnabled(next))
                    break;
            }
            q->setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    QEditorIndexHash::iterator it = editorIndexHash.begin();
    while (it != editorIndexHash.end()) {
        QModelIndex index = it.value();
        if (index.column() <= start && index.column() >= end && model->parent(index) == parent) {
            QWidget *editor = it.key();
            QEditorInfo info = indexEditorHash.take(it.value());
            it = editorIndexHash.erase(it);
            if (info.widget)
                releaseEditor(editor, index);
        } else {
            ++it;
        }
    }

}